

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexCareMinimizeAig
          (Gia_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int nTryCexes,int fCheck,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  Abc_Cex_t *pAVar4;
  Vec_Int_t *vPriosFf;
  Vec_Int_t *vPriosIn;
  int Counter;
  int nOnesCur;
  int nOnesBest;
  int i;
  int f;
  int k;
  Abc_Cex_t *pCexMin [4];
  Gia_Man_t *local_40;
  Abc_Cex_t *pCexBest;
  int fVerbose_local;
  int fCheck_local;
  int nTryCexes_local;
  Abc_Cex_t *pCex_local;
  int nRealPis_local;
  Gia_Man_t *p_local;
  
  memset(&f,0,0x20);
  iVar2 = pCex->nPis;
  iVar1 = Gia_ManPiNum(p);
  if (iVar2 == iVar1) {
    iVar2 = pCex->nRegs;
    iVar1 = Gia_ManRegNum(p);
    if (iVar2 == iVar1) {
      if ((pCex->iPo < 0) || (iVar2 = pCex->iPo, iVar1 = Gia_ManPoNum(p), iVar1 <= iVar2)) {
        printf("Given CEX has PO whose index is out of range for the AIG.\n");
        p_local = (Gia_Man_t *)0x0;
      }
      else {
        iVar2 = pCex->nPis;
        iVar1 = Gia_ManPiNum(p);
        if (iVar2 != iVar1) {
          __assert_fail("pCex->nPis == Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                        ,0x113,
                        "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                       );
        }
        iVar2 = pCex->nRegs;
        iVar1 = Gia_ManRegNum(p);
        if (iVar2 != iVar1) {
          __assert_fail("pCex->nRegs == Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                        ,0x114,
                        "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                       );
        }
        if ((pCex->iPo < 0) || (iVar2 = pCex->iPo, iVar1 = Gia_ManPoNum(p), iVar1 <= iVar2)) {
          __assert_fail("pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                        ,0x115,
                        "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                       );
        }
        if (fVerbose != 0) {
          printf("Original :    ");
          Bmc_CexPrint(pCex,nRealPis,0);
        }
        p_00 = Vec_IntAlloc(pCex->nPis * (pCex->iFrame + 1));
        p_01 = Vec_IntAlloc(pCex->nRegs * (pCex->iFrame + 1));
        for (i = 0; i < nTryCexes; i = i + 1) {
          vPriosIn._0_4_ = 0;
          Vec_IntFill(p_00,pCex->nPis * (pCex->iFrame + 1),0);
          if (i == 0) {
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              nOnesCur = Gia_ManPiNum(p);
              while (nOnesCur = nOnesCur + -1, nRealPis <= nOnesCur) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              for (nOnesCur = nRealPis + -1; -1 < nOnesCur; nOnesCur = nOnesCur + -1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
          }
          else if (i == 1) {
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              nOnesCur = Gia_ManPiNum(p);
              while (nOnesCur = nOnesCur + -1, nRealPis <= nOnesCur) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              for (nOnesCur = 0; nOnesCur < nRealPis; nOnesCur = nOnesCur + 1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
          }
          else if (i == 2) {
            for (nOnesBest = pCex->iFrame; nOnesCur = nRealPis, -1 < nOnesBest;
                nOnesBest = nOnesBest + -1) {
              for (; iVar2 = Gia_ManPiNum(p), nOnesCur < iVar2; nOnesCur = nOnesCur + 1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              for (nOnesCur = nRealPis + -1; -1 < nOnesCur; nOnesCur = nOnesCur + -1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
          }
          else {
            if (i != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                            ,0x16c,
                            "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                           );
            }
            for (nOnesBest = pCex->iFrame; nOnesCur = nRealPis, -1 < nOnesBest;
                nOnesBest = nOnesBest + -1) {
              for (; iVar2 = Gia_ManPiNum(p), nOnesCur < iVar2; nOnesCur = nOnesCur + 1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
            for (nOnesBest = pCex->iFrame; -1 < nOnesBest; nOnesBest = nOnesBest + -1) {
              for (nOnesCur = 0; nOnesCur < nRealPis; nOnesCur = nOnesCur + 1) {
                iVar2 = pCex->nPis;
                iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),
                                       pCex->nRegs + pCex->nPis * nOnesBest + nOnesCur);
                iVar1 = Abc_Var2Lit((int)vPriosIn,iVar1);
                Vec_IntWriteEntry(p_00,nOnesBest * iVar2 + nOnesCur,iVar1);
                vPriosIn._0_4_ = (int)vPriosIn + 1;
              }
            }
          }
          if ((int)vPriosIn != pCex->nPis * (pCex->iFrame + 1)) {
            __assert_fail("Counter == pCex->nPis * (pCex->iFrame + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                          ,0x16e,
                          "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                         );
          }
          Bmc_CexCarePropagateFwd(p,pCex,p_00,p_01);
          iVar2 = Vec_IntSize(p_01);
          if (iVar2 != pCex->nRegs * (pCex->iFrame + 1)) {
            __assert_fail("Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                          ,0x170,
                          "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                         );
          }
          pGVar3 = Gia_ManPo(p,pCex->iPo);
          iVar2 = Abc_LitIsCompl(pGVar3->Value);
          if (iVar2 == 0) {
            printf("Counter-example is invalid.\n");
            Vec_IntFree(p_00);
            Vec_IntFree(p_01);
            return (Abc_Cex_t *)0x0;
          }
          pAVar4 = Bmc_CexCarePropagateBwd(p,pCex,p_00,p_01);
          *(Abc_Cex_t **)(&f + (long)i * 2) = pAVar4;
          if (fVerbose != 0) {
            if (i == 0) {
              printf("PI-  PPI-:    ");
            }
            else if (i == 1) {
              printf("PI+  PPI-:    ");
            }
            else if (i == 2) {
              printf("PI-  PPI+:    ");
            }
            else {
              if (i != 3) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                              ,0x183,
                              "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                             );
              }
              printf("PI+  PPI+:    ");
            }
            Bmc_CexPrint(*(Abc_Cex_t **)(&f + (long)i * 2),nRealPis,0);
          }
        }
        Vec_IntFree(p_00);
        Vec_IntFree(p_01);
        local_40 = _f;
        Counter = Abc_CexCountOnes((Abc_Cex_t *)_f);
        for (i = 1; i < nTryCexes; i = i + 1) {
          if ((*(long *)(&f + (long)i * 2) != 0) &&
             (iVar2 = Abc_CexCountOnes(*(Abc_Cex_t **)(&f + (long)i * 2)), iVar2 < Counter)) {
            local_40 = *(Gia_Man_t **)(&f + (long)i * 2);
            Counter = iVar2;
          }
        }
        if (fVerbose != 0) {
          printf("Final    :    ");
          Bmc_CexPrint((Abc_Cex_t *)local_40,nRealPis,0);
        }
        for (i = 0; i < nTryCexes; i = i + 1) {
          if ((*(long *)(&f + (long)i * 2) != 0) && (local_40 != *(Gia_Man_t **)(&f + (long)i * 2)))
          {
            Abc_CexFreeP((Abc_Cex_t **)(&f + (long)i * 2));
          }
        }
        iVar2 = Bmc_CexVerify(p,pCex,(Abc_Cex_t *)local_40);
        if (iVar2 == 0) {
          printf("Counter-example verification has failed.\n");
        }
        else if (fCheck != 0) {
          printf("Counter-example verification succeeded.\n");
        }
        p_local = local_40;
      }
    }
    else {
      printf("Given CEX does to have same number of flops as the AIG.\n");
      p_local = (Gia_Man_t *)0x0;
    }
  }
  else {
    printf("Given CEX does to have same number of inputs as the AIG.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  return (Abc_Cex_t *)p_local;
}

Assistant:

Abc_Cex_t * Bmc_CexCareMinimizeAig( Gia_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int nTryCexes, int fCheck, int fVerbose )
{
    //int nTryCexes = 4; // belongs to range [1;4]
    Abc_Cex_t * pCexBest, * pCexMin[4] = {NULL};
    int k, f, i, nOnesBest, nOnesCur, Counter = 0;
    Vec_Int_t * vPriosIn, * vPriosFf;
    if ( pCex->nPis != Gia_ManPiNum(p) )
    {
        printf( "Given CEX does to have same number of inputs as the AIG.\n" );
        return NULL;
    }
    if ( pCex->nRegs != Gia_ManRegNum(p) )
    {
        printf( "Given CEX does to have same number of flops as the AIG.\n" );
        return NULL;
    }
    if ( !(pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p)) )
    {
        printf( "Given CEX has PO whose index is out of range for the AIG.\n" );
        return NULL;
    }
    assert( pCex->nPis == Gia_ManPiNum(p) );
    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p) );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, nRealPis, 0 );
    }
    vPriosIn = Vec_IntAlloc( pCex->nPis  * (pCex->iFrame + 1) );
    vPriosFf = Vec_IntAlloc( pCex->nRegs * (pCex->iFrame + 1) );
    for ( k = 0; k < nTryCexes; k++ )
    {
        Counter = 0;
        Vec_IntFill( vPriosIn, pCex->nPis * (pCex->iFrame + 1), 0 );
/*
        if ( k == 0 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );
*/
        if ( k == 0 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );

        assert( Counter == pCex->nPis * (pCex->iFrame + 1) );
        Bmc_CexCarePropagateFwd( p, pCex, vPriosIn, vPriosFf );
        assert( Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1) );
        if ( !Abc_LitIsCompl(Gia_ManPo(p, pCex->iPo)->Value) )
        {
            printf( "Counter-example is invalid.\n" );
            Vec_IntFree( vPriosIn );
            Vec_IntFree( vPriosFf );
            return NULL;
        }
        pCexMin[k] = Bmc_CexCarePropagateBwd( p, pCex, vPriosIn, vPriosFf );
        if ( fVerbose )
        {
            if ( k == 0 )
                printf( "PI-  PPI-:    " );
            else if ( k == 1 )
                printf( "PI+  PPI-:    " );
            else if ( k == 2 )
                printf( "PI-  PPI+:    " );
            else if ( k == 3 )
                printf( "PI+  PPI+:    " );
            else assert( 0 );
            Bmc_CexPrint( pCexMin[k], nRealPis, 0 );
        }
    }
    Vec_IntFree( vPriosIn );
    Vec_IntFree( vPriosFf );
    // select the best one
    pCexBest  = pCexMin[0];
    nOnesBest = Abc_CexCountOnes(pCexMin[0]);
    for ( k = 1; k < nTryCexes; k++ )
    {
        if ( pCexMin[k] == NULL )
            continue;
        nOnesCur = Abc_CexCountOnes(pCexMin[k]);
        if ( nOnesBest > nOnesCur )
        {
            nOnesBest = nOnesCur;
            pCexBest  = pCexMin[k];
        }
    }
    if ( fVerbose )
    {
        //Abc_Cex_t * pTotal = Bmc_CexCareTotal( pCexMin, nTryCexes );
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, nRealPis, 0 );
        //printf( "Total    :    " );
        //Bmc_CexPrint( pTotal, nRealPis, 0 );
        //Abc_CexFreeP( &pTotal );
    }
    for ( k = 0; k < nTryCexes; k++ )
        if ( pCexMin[k] && pCexBest != pCexMin[k] )
            Abc_CexFreeP( &pCexMin[k] );
    // verify and return
    if ( !Bmc_CexVerify( p, pCex, pCexBest ) )
        printf( "Counter-example verification has failed.\n" );
    else if ( fCheck ) 
        printf( "Counter-example verification succeeded.\n" );
    return pCexBest;
}